

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O2

const_iterator * __thiscall
gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end
          (const_iterator *__return_storage_ptr__,
          StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_> *this)

{
  int iVar1;
  Input **ppIVar2;
  Input *pIVar3;
  
  iVar1 = this->bsize;
  ppIVar2 = this->dataptr;
  if ((long)iVar1 == 0x20) {
    if (ppIVar2 == (Input **)0x0) {
      ppIVar2 = &end::emptyValue;
    }
    else {
      ppIVar2 = ppIVar2 + (long)this->dataSlotIndex + 1;
    }
    pIVar3 = *ppIVar2;
    iVar1 = 0;
  }
  else {
    ppIVar2 = ppIVar2 + this->dataSlotIndex;
    pIVar3 = *ppIVar2 + iVar1;
  }
  __return_storage_ptr__->vec = ppIVar2;
  __return_storage_ptr__->ptr = pIVar3;
  __return_storage_ptr__->offset = iVar1;
  return __return_storage_ptr__;
}

Assistant:

const_iterator end() const
        {
            static const X* const emptyValue{nullptr};
            if (bsize == blockSize) {
                const X* const* ptr = (dataptr != nullptr) ?
                    &(dataptr[dataSlotIndex + 1]) :
                    &emptyValue;
                return {ptr, 0};
            }
            const X* const* ptr = &(dataptr[dataSlotIndex]);
            return {ptr, bsize};
        }